

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaSAXHandleStartElementNs
               (void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI,int nb_namespaces,
               xmlChar **namespaces,int nb_attributes,int nb_defaulted,xmlChar **attributes)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  xmlChar *value_00;
  xmlChar *value;
  int local_60;
  int l;
  int k;
  int valueLen;
  int j;
  int i;
  xmlSchemaNodeInfoPtr ielem;
  int ret;
  xmlSchemaValidCtxtPtr vctxt;
  xmlChar **namespaces_local;
  int nb_namespaces_local;
  xmlChar *URI_local;
  xmlChar *prefix_local;
  xmlChar *localname_local;
  void *ctx_local;
  
  *(int *)((long)ctx + 0xac) = *(int *)((long)ctx + 0xac) + 1;
  if ((*(int *)((long)ctx + 0x130) == -1) ||
     (*(int *)((long)ctx + 0xac) < *(int *)((long)ctx + 0x130))) {
    iVar2 = xmlSchemaValidatorPushElem((xmlSchemaValidCtxtPtr)ctx);
    if (iVar2 == -1) {
      xmlSchemaInternalErr
                ((xmlSchemaAbstractCtxtPtr)ctx,"xmlSchemaSAXHandleStartElementNs",
                 "calling xmlSchemaValidatorPushElem()");
    }
    else {
      lVar1 = *(long *)((long)ctx + 0xc0);
      iVar2 = xmlSAX2GetLineNumber(*(void **)((long)ctx + 0x50));
      *(int *)(lVar1 + 0x10) = iVar2;
      *(xmlChar **)(lVar1 + 0x18) = localname;
      *(xmlChar **)(lVar1 + 0x20) = URI;
      *(uint *)(lVar1 + 0x40) = *(uint *)(lVar1 + 0x40) | 0x20;
      if (nb_namespaces != 0) {
        k = 0;
        for (valueLen = 0; valueLen < nb_namespaces; valueLen = valueLen + 1) {
          if (*(long *)(lVar1 + 0x78) == 0) {
            pvVar3 = (*xmlMalloc)(0x50);
            *(void **)(lVar1 + 0x78) = pvVar3;
            if (*(long *)(lVar1 + 0x78) == 0) {
              xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)ctx,
                                  "allocating namespace bindings for SAX validation",(xmlNodePtr)0x0
                                 );
              goto LAB_0020363e;
            }
            *(undefined4 *)(lVar1 + 0x80) = 0;
            *(undefined4 *)(lVar1 + 0x84) = 5;
          }
          else if (*(int *)(lVar1 + 0x84) <= *(int *)(lVar1 + 0x80)) {
            *(int *)(lVar1 + 0x84) = *(int *)(lVar1 + 0x84) << 1;
            pvVar3 = (*xmlRealloc)(*(void **)(lVar1 + 0x78),(long)(*(int *)(lVar1 + 0x84) << 1) << 3
                                  );
            *(void **)(lVar1 + 0x78) = pvVar3;
            if (*(long *)(lVar1 + 0x78) == 0) {
              xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)ctx,
                                  "re-allocating namespace bindings for SAX validation",
                                  (xmlNodePtr)0x0);
              goto LAB_0020363e;
            }
          }
          *(xmlChar **)(*(long *)(lVar1 + 0x78) + (long)(*(int *)(lVar1 + 0x80) << 1) * 8) =
               namespaces[k];
          if (*namespaces[k + 1] == '\0') {
            *(undefined8 *)(*(long *)(lVar1 + 0x78) + (long)(*(int *)(lVar1 + 0x80) * 2 + 1) * 8) =
                 0;
          }
          else {
            *(xmlChar **)(*(long *)(lVar1 + 0x78) + (long)(*(int *)(lVar1 + 0x80) * 2 + 1) * 8) =
                 namespaces[k + 1];
          }
          *(int *)(lVar1 + 0x80) = *(int *)(lVar1 + 0x80) + 1;
          k = k + 2;
        }
      }
      if (nb_attributes != 0) {
        k = 0;
        for (valueLen = 0; valueLen < nb_attributes; valueLen = valueLen + 1) {
          iVar2 = (int)attributes[k + 4] - (int)attributes[k + 3];
          value_00 = (xmlChar *)(*xmlMallocAtomic)((long)(iVar2 + 1));
          if (value_00 == (xmlChar *)0x0) {
            xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)ctx,"allocating string for decoded attribute"
                                ,(xmlNodePtr)0x0);
            goto LAB_0020363e;
          }
          local_60 = 0;
          value._4_4_ = 0;
          while (local_60 < iVar2) {
            if ((((local_60 < iVar2 + -4) && (attributes[k + 3][local_60] == '&')) &&
                (attributes[k + 3][local_60 + 1] == '#')) &&
               (((attributes[k + 3][local_60 + 2] == '3' && (attributes[k + 3][local_60 + 3] == '8')
                 ) && (attributes[k + 3][local_60 + 4] == ';')))) {
              value_00[value._4_4_] = '&';
              local_60 = local_60 + 5;
            }
            else {
              value_00[value._4_4_] = attributes[k + 3][local_60];
              local_60 = local_60 + 1;
            }
            value._4_4_ = value._4_4_ + 1;
          }
          value_00[value._4_4_] = '\0';
          iVar2 = xmlSchemaValidatorPushAttribute
                            ((xmlSchemaValidCtxtPtr)ctx,(xmlNodePtr)0x0,*(int *)(lVar1 + 0x10),
                             attributes[k],attributes[k + 2],0,value_00,1);
          if (iVar2 == -1) {
            xmlSchemaInternalErr
                      ((xmlSchemaAbstractCtxtPtr)ctx,"xmlSchemaSAXHandleStartElementNs",
                       "calling xmlSchemaValidatorPushAttribute()");
            goto LAB_0020363e;
          }
          k = k + 5;
        }
      }
      iVar2 = xmlSchemaValidateElem((xmlSchemaValidCtxtPtr)ctx);
      if (iVar2 == 0) {
        return;
      }
      if (iVar2 != -1) {
        return;
      }
      xmlSchemaInternalErr
                ((xmlSchemaAbstractCtxtPtr)ctx,"xmlSchemaSAXHandleStartElementNs",
                 "calling xmlSchemaValidateElem()");
    }
LAB_0020363e:
    *(undefined4 *)((long)ctx + 0x68) = 0xffffffff;
    xmlStopParser(*(xmlParserCtxtPtr *)((long)ctx + 0x50));
  }
  return;
}

Assistant:

static void
xmlSchemaSAXHandleStartElementNs(void *ctx,
				 const xmlChar * localname,
				 const xmlChar * prefix ATTRIBUTE_UNUSED,
				 const xmlChar * URI,
				 int nb_namespaces,
				 const xmlChar ** namespaces,
				 int nb_attributes,
				 int nb_defaulted ATTRIBUTE_UNUSED,
				 const xmlChar ** attributes)
{
    xmlSchemaValidCtxtPtr vctxt = (xmlSchemaValidCtxtPtr) ctx;
    int ret;
    xmlSchemaNodeInfoPtr ielem;
    int i, j;

    /*
    * SAX VAL TODO: What to do with nb_defaulted?
    */
    /*
    * Skip elements if inside a "skip" wildcard or invalid.
    */
    vctxt->depth++;
    if ((vctxt->skipDepth != -1) && (vctxt->depth >= vctxt->skipDepth))
	return;
    /*
    * Push the element.
    */
    if (xmlSchemaValidatorPushElem(vctxt) == -1) {
	VERROR_INT("xmlSchemaSAXHandleStartElementNs",
	    "calling xmlSchemaValidatorPushElem()");
	goto internal_error;
    }
    ielem = vctxt->inode;
    /*
    * TODO: Is this OK?
    */
    ielem->nodeLine = xmlSAX2GetLineNumber(vctxt->parserCtxt);
    ielem->localName = localname;
    ielem->nsName = URI;
    ielem->flags |= XML_SCHEMA_ELEM_INFO_EMPTY;
    /*
    * Register namespaces on the elem info.
    */
    if (nb_namespaces != 0) {
	/*
	* Although the parser builds its own namespace list,
	* we have no access to it, so we'll use an own one.
	*/
        for (i = 0, j = 0; i < nb_namespaces; i++, j += 2) {
	    /*
	    * Store prefix and namespace name.
	    */
	    if (ielem->nsBindings == NULL) {
		ielem->nsBindings =
		    (const xmlChar **) xmlMalloc(10 *
			sizeof(const xmlChar *));
		if (ielem->nsBindings == NULL) {
		    xmlSchemaVErrMemory(vctxt,
			"allocating namespace bindings for SAX validation",
			NULL);
		    goto internal_error;
		}
		ielem->nbNsBindings = 0;
		ielem->sizeNsBindings = 5;
	    } else if (ielem->sizeNsBindings <= ielem->nbNsBindings) {
		ielem->sizeNsBindings *= 2;
		ielem->nsBindings =
		    (const xmlChar **) xmlRealloc(
			(void *) ielem->nsBindings,
			ielem->sizeNsBindings * 2 * sizeof(const xmlChar *));
		if (ielem->nsBindings == NULL) {
		    xmlSchemaVErrMemory(vctxt,
			"re-allocating namespace bindings for SAX validation",
			NULL);
		    goto internal_error;
		}
	    }

	    ielem->nsBindings[ielem->nbNsBindings * 2] = namespaces[j];
	    if (namespaces[j+1][0] == 0) {
		/*
		* Handle xmlns="".
		*/
		ielem->nsBindings[ielem->nbNsBindings * 2 + 1] = NULL;
	    } else
		ielem->nsBindings[ielem->nbNsBindings * 2 + 1] =
		    namespaces[j+1];
	    ielem->nbNsBindings++;
	}
    }
    /*
    * Register attributes.
    * SAX VAL TODO: We are not adding namespace declaration
    * attributes yet.
    */
    if (nb_attributes != 0) {
	int valueLen, k, l;
	xmlChar *value;

        for (j = 0, i = 0; i < nb_attributes; i++, j += 5) {
	    /*
	    * Duplicate the value, changing any &#38; to a literal ampersand.
	    *
	    * libxml2 differs from normal SAX here in that it escapes all ampersands
	    * as &#38; instead of delivering the raw converted string. Changing the
	    * behavior at this point would break applications that use this API, so
	    * we are forced to work around it.
	    */
	    valueLen = attributes[j+4] - attributes[j+3];
	    value = xmlMallocAtomic(valueLen + 1);
	    if (value == NULL) {
		xmlSchemaVErrMemory(vctxt,
		    "allocating string for decoded attribute",
		    NULL);
		goto internal_error;
	    }
	    for (k = 0, l = 0; k < valueLen; l++) {
		if (k < valueLen - 4 &&
		    attributes[j+3][k+0] == '&' &&
		    attributes[j+3][k+1] == '#' &&
		    attributes[j+3][k+2] == '3' &&
		    attributes[j+3][k+3] == '8' &&
		    attributes[j+3][k+4] == ';') {
		    value[l] = '&';
		    k += 5;
		} else {
		    value[l] = attributes[j+3][k];
		    k++;
		}
	    }
	    value[l] = '\0';
	    /*
	    * TODO: Set the node line.
	    */
	    ret = xmlSchemaValidatorPushAttribute(vctxt,
		NULL, ielem->nodeLine, attributes[j], attributes[j+2], 0,
		value, 1);
	    if (ret == -1) {
		VERROR_INT("xmlSchemaSAXHandleStartElementNs",
		    "calling xmlSchemaValidatorPushAttribute()");
		goto internal_error;
	    }
	}
    }
    /*
    * Validate the element.
    */
    ret = xmlSchemaValidateElem(vctxt);
    if (ret != 0) {
	if (ret == -1) {
	    VERROR_INT("xmlSchemaSAXHandleStartElementNs",
		"calling xmlSchemaValidateElem()");
	    goto internal_error;
	}
	goto exit;
    }

exit:
    return;
internal_error:
    vctxt->err = -1;
    xmlStopParser(vctxt->parserCtxt);
    return;
}